

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall
CTcTokenizer::xlat_escapes(CTcTokenizer *this,utf8_ptr *dst,utf8_ptr *srcp,utf8_ptr *endp)

{
  byte bVar1;
  utf8_ptr uVar2;
  wchar_t ch;
  size_t sVar3;
  utf8_ptr this_00;
  utf8_ptr p;
  utf8_ptr local_28;
  
  local_28 = (utf8_ptr)srcp->p_;
  if (local_28.p_ < (CTcTokenizer *)endp->p_) {
    do {
      uVar2.p_ = local_28.p_;
      this_00.p_ = local_28.p_;
      ch = utf8_ptr::s_getch(local_28.p_);
      if (ch == L'\\') {
        xlat_escape((CTcTokenizer *)this_00.p_,dst,&local_28,L'\0',0);
      }
      else {
        sVar3 = utf8_ptr::s_putch(dst->p_,ch);
        dst->p_ = dst->p_ + sVar3;
        bVar1 = *uVar2.p_;
        local_28.p_ = uVar2.p_ + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      }
    } while (local_28.p_ < (CTcTokenizer *)endp->p_);
  }
  return;
}

Assistant:

virtual void add(CVmHashEntry *entry) { tab.add(entry); }